

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O3

int uv_async_send(uv_async_t *handle)

{
  ssize_t sVar1;
  int *piVar2;
  int iVar3;
  size_t __n;
  char *__buf;
  
  if (handle->pending == 0) {
    LOCK();
    iVar3 = handle->pending;
    if (iVar3 == 0) {
      handle->pending = 1;
      iVar3 = 0;
    }
    UNLOCK();
    if (iVar3 == 0) {
      iVar3 = handle->loop->async_wfd;
      if (iVar3 == -1) {
        iVar3 = (handle->loop->async_io_watcher).fd;
        __buf = "\x01";
        __n = 8;
      }
      else {
        __buf = "";
        __n = 1;
      }
      do {
        sVar1 = write(iVar3,__buf,__n);
        if ((int)sVar1 != -1) {
          if ((long)(int)sVar1 == __n) goto LAB_00117a40;
          goto LAB_00117a34;
        }
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
      if (*piVar2 == 0xb) {
LAB_00117a40:
        LOCK();
        iVar3 = handle->pending;
        if (iVar3 == 1) {
          handle->pending = 2;
          iVar3 = 1;
        }
        UNLOCK();
        if (iVar3 == 1) {
          return 0;
        }
      }
LAB_00117a34:
      abort();
    }
  }
  return 0;
}

Assistant:

int uv_async_send(uv_async_t* handle) {
  /* Do a cheap read first. */
  if (ACCESS_ONCE(int, handle->pending) != 0)
    return 0;

  /* Tell the other thread we're busy with the handle. */
  if (cmpxchgi(&handle->pending, 0, 1) != 0)
    return 0;

  /* Wake up the other thread's event loop. */
  uv__async_send(handle->loop);

  /* Tell the other thread we're done. */
  if (cmpxchgi(&handle->pending, 1, 2) != 1)
    abort();

  return 0;
}